

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O1

void __thiscall calculator::Lexer::scan(Lexer *this)

{
  int *piVar1;
  char *pcVar2;
  pointer psVar3;
  bool bVar4;
  size_type this_00;
  bool bVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  iterator iVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  Token *pTVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  iterator iVar14;
  Number *__p;
  iterator iVar15;
  _Elt_pointer pbVar16;
  Float *__p_00;
  iterator iVar17;
  mapped_type *pmVar18;
  SyntaxError *pSVar19;
  ZeroNumberException *this_01;
  FunctionNotDefined *this_02;
  pointer pcVar20;
  HexBinOctException *pHVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  _Alloc_hider _Var27;
  ulong uVar28;
  ulong unaff_R12;
  byte bVar29;
  bool bVar30;
  string s;
  string str;
  string local_1f8;
  pointer local_1d8;
  undefined1 local_1d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0 [7];
  ios_base local_150 [264];
  shared_ptr<calculator::Token> local_48;
  pointer local_38;
  
  iVar7 = (this->reader_).len_;
  lVar9 = (long)iVar7;
  iVar22 = (this->reader_).ptr_;
  lVar24 = (long)iVar22;
  if (iVar22 < iVar7) {
    pcVar2 = (this->reader_).sbuffer_;
    iVar22 = this->line_;
LAB_0010c7da:
    lVar24 = lVar24 + 1;
    (this->reader_).ptr_ = (int)lVar24;
    unaff_R12 = 0xff;
    if (lVar24 < lVar9) {
      unaff_R12 = (ulong)(byte)pcVar2[lVar24];
    }
    if ((byte)unaff_R12 < 0x2e) {
      if ((0x100000a01U >> (unaff_R12 & 0x3f) & 1) != 0) goto LAB_0010c800;
      if (unaff_R12 == 10) {
        iVar22 = iVar22 + 1;
        this->line_ = iVar22;
        goto LAB_0010c800;
      }
      if ((0x280000000000U >> (unaff_R12 & 0x3f) & 1) == 0) goto LAB_0010c889;
      uVar25 = (ulong)(this->reader_).ptr_;
      uVar26 = uVar25;
      while( true ) {
        uVar26 = uVar26 + 1;
        uVar8 = (int)uVar25 + 1;
        (this->reader_).ptr_ = uVar8;
        uVar28 = 0xff;
        if ((long)uVar26 < lVar9) {
          uVar28 = (ulong)(byte)(this->reader_).sbuffer_[uVar26];
        }
        if ((0x20 < (byte)uVar28) || ((0x100000a01U >> (uVar28 & 0x3f) & 1) == 0)) break;
        uVar25 = (ulong)uVar8;
      }
      if ((byte)unaff_R12 == (byte)uVar28) {
        pSVar19 = (SyntaxError *)__cxa_allocate_exception(0x28);
        local_1d0._0_8_ = &((key_type *)local_1d0)->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1d0,"can not present continue symbol ++/--","");
        SyntaxError::SyntaxError(pSVar19,(string *)local_1d0);
        __cxa_throw(pSVar19,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
      }
      (this->reader_).ptr_ = (int)uVar25;
    }
    else {
LAB_0010c889:
      if ((int)unaff_R12 == 0xff) {
        return;
      }
    }
  }
LAB_0010c896:
  bVar29 = this->lookforward_;
  if ((((bVar29 != 0x29) && ((bVar29 & 0xdf) != 0x45)) &&
      ((bVar30 = (char)unaff_R12 == '-', bVar30 || (((uint)unaff_R12 & 0xff) == 0x2b)))) &&
     ((9 < (byte)(bVar29 - 0x30) && (bVar29 != 0x2e && 0x19 < (byte)((bVar29 & 0xdf) + 0xbf))))) {
    iVar22 = (this->reader_).ptr_ + 1;
    (this->reader_).ptr_ = iVar22;
    unaff_R12 = 0xff;
    if (iVar7 <= iVar22) goto LAB_0010e2e5;
    do {
      unaff_R12 = (ulong)(byte)(this->reader_).sbuffer_[iVar22];
LAB_0010e2e5:
      iVar22 = (this->reader_).ptr_;
      do {
        if ((0x20 < (byte)unaff_R12) || ((0x100000a01U >> (unaff_R12 & 0x3f) & 1) == 0))
        goto LAB_0010c8e0;
        iVar22 = iVar22 + 1;
        (this->reader_).ptr_ = iVar22;
        unaff_R12 = 0xff;
      } while (iVar7 <= iVar22);
    } while( true );
  }
  bVar30 = false;
LAB_0010c8e0:
  bVar29 = (byte)unaff_R12;
  this->lookforward_ = bVar29;
  uVar8 = (uint)unaff_R12 & 0xff;
  if (0x3b < uVar8) {
    if (uVar8 < 0x5e) {
      if (uVar8 == 0x3c) {
        iVar22 = (this->reader_).ptr_;
        lVar9 = (long)iVar22 + 1;
        iVar23 = (int)lVar9;
        (this->reader_).ptr_ = iVar23;
        if ((iVar7 <= iVar23) || ((this->reader_).sbuffer_[lVar9] != '<')) {
          (this->reader_).ptr_ = iVar22;
          pSVar19 = (SyntaxError *)__cxa_allocate_exception(0x28);
          local_1d0._0_8_ = &((key_type *)local_1d0)->field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"unexpected <?","");
          SyntaxError::SyntaxError(pSVar19,(string *)local_1d0);
          __cxa_throw(pSVar19,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
        }
        pTVar12 = (Token *)operator_new(0x48);
        Token::Token(pTVar12,ShiftLeft);
        local_1d0._0_8_ = pTVar12;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &((key_type *)local_1d0)->_M_string_length,pTVar12);
        std::
        vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
        ::emplace_back<std::shared_ptr<calculator::Token>>
                  ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                    *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
        goto LAB_0010cf72;
      }
      if (uVar8 == 0x3d) {
        pTVar12 = (Token *)operator_new(0x48);
        Token::Token(pTVar12,Equal);
        local_1d0._0_8_ = pTVar12;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &((key_type *)local_1d0)->_M_string_length,pTVar12);
        std::
        vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
        ::emplace_back<std::shared_ptr<calculator::Token>>
                  ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                    *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
        goto LAB_0010cf72;
      }
      if (uVar8 == 0x3e) {
        iVar22 = (this->reader_).ptr_;
        lVar9 = (long)iVar22 + 1;
        iVar23 = (int)lVar9;
        (this->reader_).ptr_ = iVar23;
        if ((iVar7 <= iVar23) || ((this->reader_).sbuffer_[lVar9] != '>')) {
          (this->reader_).ptr_ = iVar22;
          pSVar19 = (SyntaxError *)__cxa_allocate_exception(0x28);
          local_1d0._0_8_ = &((key_type *)local_1d0)->field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"unexpected >?","");
          SyntaxError::SyntaxError(pSVar19,(string *)local_1d0);
          __cxa_throw(pSVar19,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
        }
        pTVar12 = (Token *)operator_new(0x48);
        Token::Token(pTVar12,ShiftRight);
        local_1d0._0_8_ = pTVar12;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &((key_type *)local_1d0)->_M_string_length,pTVar12);
        std::
        vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
        ::emplace_back<std::shared_ptr<calculator::Token>>
                  ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                    *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
        goto LAB_0010cf72;
      }
    }
    else {
      if (uVar8 == 0x5e) {
        pTVar12 = (Token *)operator_new(0x48);
        Token::Token(pTVar12,Xor);
        local_1d0._0_8_ = pTVar12;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &((key_type *)local_1d0)->_M_string_length,pTVar12);
        std::
        vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
        ::emplace_back<std::shared_ptr<calculator::Token>>
                  ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                    *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
        goto LAB_0010cf72;
      }
      if (uVar8 == 0x7c) {
        pTVar12 = (Token *)operator_new(0x48);
        Token::Token(pTVar12,Or);
        local_1d0._0_8_ = pTVar12;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &((key_type *)local_1d0)->_M_string_length,pTVar12);
        std::
        vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
        ::emplace_back<std::shared_ptr<calculator::Token>>
                  ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                    *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
        goto LAB_0010cf72;
      }
      if (uVar8 == 0x7e) {
        pTVar12 = (Token *)operator_new(0x48);
        Token::Token(pTVar12,Negate);
        local_1d0._0_8_ = pTVar12;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &((key_type *)local_1d0)->_M_string_length,pTVar12);
        std::
        vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
        ::emplace_back<std::shared_ptr<calculator::Token>>
                  ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                    *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
        goto LAB_0010cf72;
      }
    }
    goto switchD_0010c90a_caseD_22;
  }
  switch(uVar8) {
  case 0x21:
    pTVar12 = (Token *)operator_new(0x48);
    Token::Token(pTVar12,Not);
    local_1d0._0_8_ = pTVar12;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &((key_type *)local_1d0)->_M_string_length,pTVar12);
    std::
    vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>::
    emplace_back<std::shared_ptr<calculator::Token>>
              ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
    break;
  default:
    goto switchD_0010c90a_caseD_22;
  case 0x25:
    pTVar12 = (Token *)operator_new(0x48);
    Token::Token(pTVar12,Mod);
    local_1d0._0_8_ = pTVar12;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &((key_type *)local_1d0)->_M_string_length,pTVar12);
    std::
    vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>::
    emplace_back<std::shared_ptr<calculator::Token>>
              ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
    break;
  case 0x26:
    pTVar12 = (Token *)operator_new(0x48);
    Token::Token(pTVar12,And);
    local_1d0._0_8_ = pTVar12;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &((key_type *)local_1d0)->_M_string_length,pTVar12);
    std::
    vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>::
    emplace_back<std::shared_ptr<calculator::Token>>
              ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
    break;
  case 0x2a:
    iVar22 = (this->reader_).ptr_;
    lVar9 = (long)iVar22 + 1;
    iVar23 = (int)lVar9;
    (this->reader_).ptr_ = iVar23;
    if ((iVar23 < iVar7) && ((this->reader_).sbuffer_[lVar9] == '*')) {
      pTVar12 = (Token *)operator_new(0x48);
      Token::Token(pTVar12,Pow);
      local_1d0._0_8_ = pTVar12;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &((key_type *)local_1d0)->_M_string_length,pTVar12);
      std::
      vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
      ::emplace_back<std::shared_ptr<calculator::Token>>
                ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                  *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
    }
    else {
      (this->reader_).ptr_ = iVar22;
      pTVar12 = (Token *)operator_new(0x48);
      Token::Token(pTVar12,Mul);
      local_1d0._0_8_ = pTVar12;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &((key_type *)local_1d0)->_M_string_length,pTVar12);
      std::
      vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
      ::emplace_back<std::shared_ptr<calculator::Token>>
                ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                  *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
    }
    break;
  case 0x2b:
    pTVar12 = (Token *)operator_new(0x48);
    Token::Token(pTVar12,Add);
    local_1d0._0_8_ = pTVar12;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &((key_type *)local_1d0)->_M_string_length,pTVar12);
    std::
    vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>::
    emplace_back<std::shared_ptr<calculator::Token>>
              ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
    break;
  case 0x2d:
    if (bVar30 == false) {
      pTVar12 = (Token *)operator_new(0x48);
      Token::Token(pTVar12,Sub);
      local_1d0._0_8_ = pTVar12;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &((key_type *)local_1d0)->_M_string_length,pTVar12);
      std::
      vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
      ::emplace_back<std::shared_ptr<calculator::Token>>
                ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                  *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
      break;
    }
    if (bVar29 == 0x30) goto switchD_0010c90a_caseD_30;
switchD_0010c90a_caseD_22:
    if (bVar29 != 0x2e && 9 < (byte)(bVar29 - 0x30)) {
      if (0x19 < (byte)((bVar29 & 0xdf) + 0xbf)) {
        if (bVar29 == 0x28) {
          if (this->is_function_ == true) {
            local_1d0[0] = 1;
            std::deque<bool,_std::allocator<bool>_>::emplace_back<bool>
                      (&(this->bracket_match_).c,(bool *)local_1d0);
            this->is_function_ = false;
            pTVar12 = (Token *)operator_new(0x48);
            Token::Token(pTVar12,BEGIN_FUNC);
            local_1d0._0_8_ = pTVar12;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &((key_type *)local_1d0)->_M_string_length,pTVar12);
            std::
            vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
            ::emplace_back<std::shared_ptr<calculator::Token>>
                      ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                        *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
          }
          else {
            local_1d0._0_8_ = (ulong)(uint7)local_1d0._1_7_ << 8;
            std::deque<bool,_std::allocator<bool>_>::emplace_back<bool>
                      (&(this->bracket_match_).c,(bool *)local_1d0);
            this->is_function_ = false;
            pTVar12 = (Token *)operator_new(0x48);
            Token::Token(pTVar12,BEGIN_BRACKET);
            local_1d0._0_8_ = pTVar12;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &((key_type *)local_1d0)->_M_string_length,pTVar12);
            std::
            vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
            ::emplace_back<std::shared_ptr<calculator::Token>>
                      ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                        *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
          }
        }
        else if (uVar8 == 0x29) {
          pbVar16 = (this->bracket_match_).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur;
          if (pbVar16 ==
              (this->bracket_match_).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur) {
            pSVar19 = (SyntaxError *)__cxa_allocate_exception(0x28);
            local_1d0._0_8_ = &((key_type *)local_1d0)->field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1d0,"expression unexpected (!","");
            SyntaxError::SyntaxError(pSVar19,(string *)local_1d0);
            __cxa_throw(pSVar19,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
          }
          if (pbVar16 ==
              (this->bracket_match_).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
              super__Deque_impl_data._M_finish._M_first) {
            pbVar16 = (this->bracket_match_).c.super__Deque_base<bool,_std::allocator<bool>_>.
                      _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x200;
          }
          bVar30 = pbVar16[-1];
          std::deque<bool,_std::allocator<bool>_>::pop_back(&(this->bracket_match_).c);
          this->is_function_ = false;
          if (bVar30 == true) {
            pTVar12 = (Token *)operator_new(0x48);
            Token::Token(pTVar12,END_FUNC);
            local_1d0._0_8_ = pTVar12;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &((key_type *)local_1d0)->_M_string_length,pTVar12);
            std::
            vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
            ::emplace_back<std::shared_ptr<calculator::Token>>
                      ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                        *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
          }
          else {
            pTVar12 = (Token *)operator_new(0x48);
            Token::Token(pTVar12,END_BRACKET);
            local_1d0._0_8_ = pTVar12;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &((key_type *)local_1d0)->_M_string_length,pTVar12);
            std::
            vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
            ::emplace_back<std::shared_ptr<calculator::Token>>
                      ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                        *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
          }
        }
        else if (uVar8 == 0x3b) {
          psVar3 = (this->tokenlist_).
                   super__Vector_base<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (((this->tokenlist_).
               super__Vector_base<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
               ._M_impl.super__Vector_impl_data._M_start != psVar3) &&
             (iVar7 = (*(psVar3[-1].
                         super___shared_ptr<calculator::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        _vptr_Token[2])(), iVar7 == 0x13)) {
            return;
          }
          pTVar12 = (Token *)operator_new(0x48);
          Token::Token(pTVar12,END_SEP);
          local_1d0._0_8_ = pTVar12;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &((key_type *)local_1d0)->_M_string_length,pTVar12);
          std::
          vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
          ::emplace_back<std::shared_ptr<calculator::Token>>
                    ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                      *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
        }
        else {
          pTVar12 = (Token *)operator_new(0x48);
          Token::Token(pTVar12,bVar29);
          local_1d0._0_8_ = pTVar12;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &((key_type *)local_1d0)->_M_string_length,pTVar12);
          std::
          vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
          ::emplace_back<std::shared_ptr<calculator::Token>>
                    ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                      *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
        }
        break;
      }
      local_1d0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1c0[0]._M_local_buf[0] = '\0';
      local_1d0._0_8_ = &((key_type *)local_1d0)->field_2;
      do {
        std::__cxx11::string::_M_replace_aux((ulong)local_1d0,local_1d0._8_8_,0,'\x01');
        lVar9 = (long)(this->reader_).ptr_ + 1;
        iVar7 = (int)lVar9;
        (this->reader_).ptr_ = iVar7;
        bVar29 = 0xff;
        if (iVar7 < (this->reader_).len_) {
          bVar29 = (this->reader_).sbuffer_[lVar9];
        }
      } while ((byte)((bVar29 & 0xdf) + 0xbf) < 0x1a);
      if ((byte)(bVar29 - 0x30) < 10) {
        do {
          std::__cxx11::string::_M_replace_aux((ulong)local_1d0,local_1d0._8_8_,0,'\x01');
          lVar9 = (long)(this->reader_).ptr_ + 1;
          iVar7 = (int)lVar9;
          (this->reader_).ptr_ = iVar7;
          bVar29 = 0xff;
          if (iVar7 < (this->reader_).len_) {
            bVar29 = (this->reader_).sbuffer_[lVar9];
          }
        } while ((byte)(bVar29 - 0x30) < 10);
      }
      if (bVar29 == 0x28) {
        iVar10 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(this->unary_functions)._M_h,(key_type *)local_1d0);
        if (iVar10.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          iVar17 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double,_double)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double,_double)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&(this->binary_functions)._M_h,(key_type *)local_1d0);
          if (iVar17.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double,_double)>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            this_02 = (FunctionNotDefined *)__cxa_allocate_exception(0x28);
            FunctionNotDefined::FunctionNotDefined(this_02,(string *)local_1d0);
            __cxa_throw(this_02,&FunctionNotDefined::typeinfo,SyntaxError::~SyntaxError);
          }
          piVar1 = &(this->reader_).ptr_;
          *piVar1 = *piVar1 + -1;
          this->is_function_ = true;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)operator_new(0x70);
          Word::Word((Word *)paVar11,(string *)local_1d0,bVar30,BinaryFunction);
          paVar11->_M_allocated_capacity = (size_type)&PTR__Word_00118b08;
          local_1f8._M_dataplus._M_p = (pointer)paVar11;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<calculator::BinaryFunction*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8._M_string_length,
                     (BinaryFunction *)paVar11);
          std::
          vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
          ::emplace_back<std::shared_ptr<calculator::Token>>
                    ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                      *)&this->tokenlist_,(shared_ptr<calculator::Token> *)&local_1f8);
        }
        else {
          piVar1 = &(this->reader_).ptr_;
          *piVar1 = *piVar1 + -1;
          this->is_function_ = true;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)operator_new(0x70);
          Word::Word((Word *)paVar11,(string *)local_1d0,bVar30,Function);
          paVar11->_M_allocated_capacity = (size_type)&PTR__Word_00118ab0;
          local_1f8._M_dataplus._M_p = (pointer)paVar11;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Function*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8._M_string_length,
                     (Function *)paVar11);
          std::
          vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
          ::emplace_back<std::shared_ptr<calculator::Token>>
                    ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                      *)&this->tokenlist_,(shared_ptr<calculator::Token> *)&local_1f8);
        }
LAB_0010d965:
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length);
        }
      }
      else {
        piVar1 = &(this->reader_).ptr_;
        *piVar1 = *piVar1 + -1;
        iVar14 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(this->variable)._M_h,(key_type *)local_1d0);
        if (iVar14.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)operator_new(0x70);
          Word::Word((Word *)paVar11,(string *)local_1d0,bVar30,Identifier);
          local_1f8._M_dataplus._M_p = (pointer)paVar11;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Word*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8._M_string_length,
                     (Word *)paVar11);
          pmVar18 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&this->variable,(key_type *)local_1d0);
          (pmVar18->super___shared_ptr<calculator::Token,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
               (element_type *)local_1f8._M_dataplus._M_p;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(pmVar18->super___shared_ptr<calculator::Token,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount,
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8._M_string_length);
          std::
          vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
          ::push_back(&this->tokenlist_,(value_type *)&local_1f8);
          goto LAB_0010d965;
        }
        if (bVar30 != false) {
          __p = (Number *)operator_new(0x50);
          Token::Token((Token *)__p,Number);
          (__p->super_Token)._vptr_Token = (_func_int **)&PTR__Token_00118a20;
          __p->__value = -1;
          local_1f8._M_dataplus._M_p = (pointer)__p;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Number*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8._M_string_length,__p);
          std::
          vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
          ::emplace_back<std::shared_ptr<calculator::Token>>
                    ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                      *)&this->tokenlist_,(shared_ptr<calculator::Token> *)&local_1f8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length);
          }
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)operator_new(0x48);
          Token::Token((Token *)paVar11,Mul);
          local_1f8._M_dataplus._M_p = (pointer)paVar11;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8._M_string_length,
                     (Token *)paVar11);
          std::
          vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
          ::emplace_back<std::shared_ptr<calculator::Token>>
                    ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                      *)&this->tokenlist_,(shared_ptr<calculator::Token> *)&local_1f8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length);
          }
        }
        iVar15 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)this,(key_type *)
                                ((long)iVar14.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>,_true>
                                       ._M_cur + 8));
        if (iVar15.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
            ._M_cur != (__node_type *)0x0) {
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)operator_new(0x50);
          local_1d8 = *(pointer *)
                       ((long)iVar15.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
                              ._M_cur + 0x28);
          Token::Token((Token *)paVar11,Float);
          paVar11->_M_allocated_capacity = (size_type)&PTR__Token_00118a68;
          (((string *)(paVar11->_M_local_buf + 0x48))->_M_dataplus)._M_p = local_1d8;
          local_1f8._M_dataplus._M_p = (pointer)paVar11;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Float*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8._M_string_length,
                     (Float *)paVar11);
          std::
          vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
          ::emplace_back<std::shared_ptr<calculator::Token>>
                    ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                      *)&this->tokenlist_,(shared_ptr<calculator::Token> *)&local_1f8);
          goto LAB_0010d965;
        }
        std::
        vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
        ::push_back(&this->tokenlist_,
                    (value_type *)
                    ((long)iVar14.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>,_true>
                           ._M_cur + 0x28));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._0_8_ == &((key_type *)local_1d0)->field_2) {
        return;
      }
LAB_0010e1ee:
      lVar9 = CONCAT71(local_1c0[0]._M_allocated_capacity._1_7_,local_1c0[0]._M_local_buf[0]);
      _Var27._M_p = (pointer)local_1d0._0_8_;
      goto LAB_0010e1f3;
    }
    paVar11 = &local_1f8.field_2;
    local_1f8._M_string_length = 0;
    local_1f8.field_2._M_local_buf[0] = '\0';
    local_1f8._M_dataplus._M_p = (pointer)paVar11;
    if (bVar30 != false) {
      std::__cxx11::string::push_back((char)&local_1f8);
    }
    if (bVar29 == 0x2e) {
      bVar30 = false;
      bVar4 = false;
LAB_0010d6a8:
      std::__cxx11::string::_M_replace_aux((ulong)&local_1f8,local_1f8._M_string_length,0,'\x01');
      while( true ) {
        iVar7 = (this->reader_).ptr_;
        uVar26 = (long)iVar7 + 1;
        (this->reader_).ptr_ = (int)uVar26;
        iVar22 = (this->reader_).len_;
        bVar29 = 0xff;
        if ((int)uVar26 < iVar22) {
          bVar29 = (this->reader_).sbuffer_[uVar26];
        }
        bVar5 = bVar4;
        if (((bVar29 & 0xdf) == 0x45) && (bVar5 = true, bVar4)) {
          pSVar19 = (SyntaxError *)__cxa_allocate_exception(0x28);
          local_1d0._0_8_ = &((key_type *)local_1d0)->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1d0,"expoent e/E is to many!","");
          SyntaxError::SyntaxError(pSVar19,(string *)local_1d0);
          __cxa_throw(pSVar19,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
        }
        bVar4 = bVar5;
        if ((((bVar29 == 0x2d) || (bVar29 == 0x2b)) &&
            ((iVar7 < 0 ||
             ((bVar30 ||
              (bVar30 = true, ((this->reader_).sbuffer_[(uVar26 & 0xffffffff) - 1] & 0xdfU) != 0x45)
              ))))) ||
           (((byte)(bVar29 - 0x3a) < 0xf6 && (bVar29 & 0xdf) != 0x45 &&
            ((bVar29 != 0x2d && (bVar29 != 0x2b)))))) break;
        std::__cxx11::string::_M_replace_aux((ulong)&local_1f8,local_1f8._M_string_length,0,'\x01');
      }
      (this->reader_).ptr_ = iVar7;
      cVar6 = -1;
      if (iVar7 < iVar22 && -1 < iVar7) {
        cVar6 = (this->reader_).sbuffer_[iVar7];
      }
      this->lookforward_ = cVar6;
      __p_00 = (Float *)operator_new(0x50);
      std::__cxx11::stringstream::stringstream((stringstream *)local_1d0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&((key_type *)local_1d0)->field_2,local_1f8._M_dataplus._M_p,
                 local_1f8._M_string_length);
      std::istream::_M_extract<double>((double *)local_1d0);
      local_1d8 = local_38;
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1d0);
      std::ios_base::~ios_base(local_150);
      Token::Token((Token *)__p_00,Float);
      (__p_00->super_Token)._vptr_Token = (_func_int **)&PTR__Token_00118a68;
      __p_00->__value = (double)local_1d8;
      local_48.super___shared_ptr<calculator::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)__p_00;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Float*>
                (&local_48.super___shared_ptr<calculator::Token,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,__p_00);
      std::
      vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
      ::emplace_back<std::shared_ptr<calculator::Token>>
                ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                  *)&this->tokenlist_,&local_48);
    }
    else {
      bVar30 = false;
      while( true ) {
        bVar29 = (byte)unaff_R12;
        bVar4 = bVar30;
        if (((bVar29 & 0xdf) == 0x45) && (bVar4 = true, bVar30)) {
          pSVar19 = (SyntaxError *)__cxa_allocate_exception(0x28);
          local_1d0._0_8_ = &((key_type *)local_1d0)->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1d0,"expoent e/E is to many!","");
          SyntaxError::SyntaxError(pSVar19,(string *)local_1d0);
          __cxa_throw(pSVar19,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
        }
        if ((bVar29 == 0x2d) || (((uint)unaff_R12 & 0xff) == 0x2b)) break;
        std::__cxx11::string::_M_replace_aux((ulong)&local_1f8,local_1f8._M_string_length,0,'\x01');
        lVar9 = (long)(this->reader_).ptr_ + 1;
        iVar7 = (int)lVar9;
        (this->reader_).ptr_ = iVar7;
        unaff_R12 = 0xff;
        if (iVar7 < (this->reader_).len_) {
          unaff_R12 = (ulong)(byte)(this->reader_).sbuffer_[lVar9];
        }
        bVar29 = (byte)unaff_R12;
        bVar30 = bVar4;
        if ((9 < (byte)(bVar29 - 0x30)) &&
           ((uVar8 = (int)unaff_R12 - 0x2b, 0x3a < uVar8 ||
            ((0x400000004000005U >> ((ulong)uVar8 & 0x3f) & 1) == 0)))) goto LAB_0010d0c6;
      }
      lVar9 = (long)(this->reader_).ptr_;
      if ((0 < lVar9) && (bVar30 = true, ((this->reader_).sbuffer_[lVar9 + -1] & 0xdfU) == 0x45))
      goto LAB_0010d6a8;
LAB_0010d0c6:
      if (bVar29 == 0x2e) {
        bVar30 = false;
        goto LAB_0010d6a8;
      }
      if (((bVar29 == 0xff) && (bVar4)) &&
         ((lVar9 = (long)(this->reader_).ptr_, lVar9 < 1 ||
          (9 < (byte)((this->reader_).sbuffer_[lVar9 + -1] - 0x30U))))) {
        pSVar19 = (SyntaxError *)__cxa_allocate_exception(0x28);
        local_1d0._0_8_ = &((key_type *)local_1d0)->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1d0,"after digit e/E errro","");
        SyntaxError::SyntaxError(pSVar19,(string *)local_1d0);
        __cxa_throw(pSVar19,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
      }
      iVar7 = (this->reader_).ptr_;
      (this->reader_).ptr_ = iVar7 - 1U;
      cVar6 = -1;
      if ((0 < iVar7) && (iVar7 <= (this->reader_).len_)) {
        cVar6 = (this->reader_).sbuffer_[iVar7 - 1U];
      }
      this->lookforward_ = cVar6;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)operator_new(0x50);
      local_1d8 = (pointer)toAny<double>(&local_1f8);
      Token::Token((Token *)paVar13,Number);
      paVar13->_M_allocated_capacity = (size_type)&PTR__Token_00118a20;
      (((string *)(paVar13->_M_local_buf + 0x48))->_M_dataplus)._M_p =
           (pointer)(long)(double)local_1d8;
      local_1d0._0_8_ = paVar13;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Number*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &((key_type *)local_1d0)->_M_string_length,(Number *)paVar13);
      std::
      vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
      ::emplace_back<std::shared_ptr<calculator::Token>>
                ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                  *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
      local_48.super___shared_ptr<calculator::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_;
    }
    if (local_48.super___shared_ptr<calculator::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.super___shared_ptr<calculator::Token,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p == paVar11) {
      return;
    }
    lVar9 = CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,local_1f8.field_2._M_local_buf[0]
                    );
    _Var27._M_p = local_1f8._M_dataplus._M_p;
LAB_0010e1f3:
    operator_delete(_Var27._M_p,lVar9 + 1);
    return;
  case 0x2f:
    pTVar12 = (Token *)operator_new(0x48);
    Token::Token(pTVar12,Div);
    local_1d0._0_8_ = pTVar12;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &((key_type *)local_1d0)->_M_string_length,pTVar12);
    std::
    vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>::
    emplace_back<std::shared_ptr<calculator::Token>>
              ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
    break;
  case 0x30:
switchD_0010c90a_caseD_30:
    iVar22 = (this->reader_).ptr_;
    lVar24 = (long)iVar22;
    lVar9 = lVar24 + 1;
    iVar23 = (int)lVar9;
    if (iVar23 < iVar7) {
      if ((this->reader_).sbuffer_[lVar9] == '.') goto switchD_0010c90a_caseD_22;
      if (iVar7 <= iVar23) goto LAB_0010d1d2;
      if ((byte)((this->reader_).sbuffer_[lVar9] - 0x30U) < 10) {
        this_01 = (ZeroNumberException *)__cxa_allocate_exception(0x28);
        lVar9 = (long)(this->reader_).ptr_ + 1;
        iVar7 = -0x31;
        if ((int)lVar9 < (this->reader_).len_) {
          iVar7 = (this->reader_).sbuffer_[lVar9] + -0x30;
        }
        ZeroNumberException::ZeroNumberException(this_01,iVar7);
        __cxa_throw(this_01,&ZeroNumberException::typeinfo,SyntaxError::~SyntaxError);
      }
      (this->reader_).ptr_ = iVar23;
      cVar6 = -1;
      if (iVar23 < iVar7) {
        cVar6 = (this->reader_).sbuffer_[lVar9];
      }
    }
    else {
LAB_0010d1d2:
      (this->reader_).ptr_ = iVar23;
      cVar6 = -1;
    }
    paVar11 = &((key_type *)local_1d0)->field_2;
    local_1d0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1c0[0]._M_local_buf[0] = '\0';
    local_1d0._0_8_ = paVar11;
    if (cVar6 == 'b') {
      iVar22 = (int)(lVar24 + 2);
      (this->reader_).ptr_ = iVar22;
      bVar29 = 0xff;
      if (iVar22 < iVar7) {
        bVar29 = (this->reader_).sbuffer_[lVar24 + 2];
      }
      if ((bVar29 & 0xfe) == 0x30) {
        do {
          std::__cxx11::string::_M_replace_aux((ulong)local_1d0,local_1d0._8_8_,0,'\x01');
          lVar9 = (long)(this->reader_).ptr_ + 1;
          iVar7 = (int)lVar9;
          (this->reader_).ptr_ = iVar7;
          bVar29 = 0xff;
          if (iVar7 < (this->reader_).len_) {
            bVar29 = (this->reader_).sbuffer_[lVar9];
          }
        } while ((bVar29 & 0xfe) == 0x30);
      }
      if (((byte)(bVar29 - 0x32) < 8) || ((byte)((bVar29 & 0xdf) + 0xbf) < 0x1a)) {
        pHVar21 = (HexBinOctException *)__cxa_allocate_exception(0x28);
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_1f8,'\x01');
        HexBinOctException::HexBinOctException(pHVar21,&local_1f8);
        __cxa_throw(pHVar21,&HexBinOctException::typeinfo,SyntaxError::~SyntaxError);
      }
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)operator_new(0x50);
      pcVar20 = (pointer)toBase<long,2ul>((string *)local_1d0);
      Token::Token((Token *)paVar13,Number);
      paVar13->_M_allocated_capacity = (size_type)&PTR__Token_00118a20;
      (((string *)(paVar13->_M_local_buf + 0x48))->_M_dataplus)._M_p = pcVar20;
      local_1f8._M_dataplus._M_p = (pointer)paVar13;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Number*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8._M_string_length,
                 (Number *)paVar13);
    }
    else if (cVar6 == 'o') {
      iVar22 = (int)(lVar24 + 2);
      (this->reader_).ptr_ = iVar22;
      bVar29 = 0xff;
      if (iVar22 < iVar7) {
        bVar29 = (this->reader_).sbuffer_[lVar24 + 2];
      }
      if ((bVar29 & 0xf8) == 0x30) {
        do {
          std::__cxx11::string::_M_replace_aux((ulong)local_1d0,local_1d0._8_8_,0,'\x01');
          lVar9 = (long)(this->reader_).ptr_ + 1;
          iVar7 = (int)lVar9;
          (this->reader_).ptr_ = iVar7;
          bVar29 = 0xff;
          if (iVar7 < (this->reader_).len_) {
            bVar29 = (this->reader_).sbuffer_[lVar9];
          }
        } while ((bVar29 & 0xf8) == 0x30);
      }
      if (((byte)(bVar29 - 0x30) < 10 && (bVar29 & 0xfe) == 0x38) ||
         ((byte)((bVar29 & 0xdf) + 0xbf) < 0x1a)) {
        pHVar21 = (HexBinOctException *)__cxa_allocate_exception(0x28);
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_1f8,'\x01');
        HexBinOctException::HexBinOctException(pHVar21,&local_1f8);
        __cxa_throw(pHVar21,&HexBinOctException::typeinfo,SyntaxError::~SyntaxError);
      }
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)operator_new(0x50);
      pcVar20 = (pointer)toBase<long,8ul>((string *)local_1d0);
      Token::Token((Token *)paVar13,Number);
      paVar13->_M_allocated_capacity = (size_type)&PTR__Token_00118a20;
      (((string *)(paVar13->_M_local_buf + 0x48))->_M_dataplus)._M_p = pcVar20;
      local_1f8._M_dataplus._M_p = (pointer)paVar13;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Number*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8._M_string_length,
                 (Number *)paVar13);
    }
    else {
      if (cVar6 == 'x') {
        iVar22 = iVar22 + 2;
        (this->reader_).ptr_ = iVar22;
        bVar29 = 0xff;
        if (iVar7 <= iVar22) goto LAB_0010e0b4;
        do {
          bVar29 = (this->reader_).sbuffer_[iVar22];
LAB_0010e0b4:
          do {
            if ((9 < (byte)(bVar29 - 0x30)) &&
               ((0x25 < bVar29 - 0x41 ||
                ((0x3f0000003fU >> ((ulong)(bVar29 - 0x41) & 0x3f) & 1) == 0)))) {
              if (('F' < (char)bVar29) && ((byte)((bVar29 & 0xdf) + 0xbf) < 0x1a)) {
                pHVar21 = (HexBinOctException *)__cxa_allocate_exception(0x28);
                local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
                std::__cxx11::string::_M_construct((ulong)&local_1f8,'\x01');
                HexBinOctException::HexBinOctException(pHVar21,&local_1f8);
                __cxa_throw(pHVar21,&HexBinOctException::typeinfo,SyntaxError::~SyntaxError);
              }
              paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)operator_new(0x50);
              pcVar20 = (pointer)toBase<long,16ul>((string *)local_1d0);
              Token::Token((Token *)paVar13,Number);
              paVar13->_M_allocated_capacity = (size_type)&PTR__Token_00118a20;
              (((string *)(paVar13->_M_local_buf + 0x48))->_M_dataplus)._M_p = pcVar20;
              local_1f8._M_dataplus._M_p = (pointer)paVar13;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Number*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8._M_string_length,
                         (Number *)paVar13);
              goto LAB_0010e168;
            }
            std::__cxx11::string::_M_replace_aux((ulong)local_1d0,local_1d0._8_8_,0,'\x01');
            iVar22 = (this->reader_).ptr_ + 1;
            (this->reader_).ptr_ = iVar22;
            bVar29 = 0xff;
          } while ((this->reader_).len_ <= iVar22);
        } while( true );
      }
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)operator_new(0x50);
      Token::Token((Token *)paVar13,Number);
      paVar13->_M_allocated_capacity = (size_type)&PTR__Token_00118a20;
      (((string *)(paVar13->_M_local_buf + 0x48))->_M_dataplus)._M_p = (pointer)0x0;
      local_1f8._M_dataplus._M_p = (pointer)paVar13;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Number*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8._M_string_length,
                 (Number *)paVar13);
    }
LAB_0010e168:
    this_00 = local_1f8._M_string_length;
    piVar1 = &(this->reader_).ptr_;
    *piVar1 = *piVar1 + -1;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_1f8._M_string_length + 8) =
             *(_Atomic_word *)(local_1f8._M_string_length + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_1f8._M_string_length + 8) =
             *(_Atomic_word *)(local_1f8._M_string_length + 8) + 1;
      }
    }
    std::
    vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>::
    emplace_back<std::shared_ptr<calculator::Token>>
              ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                *)&this->tokenlist_,(shared_ptr<calculator::Token> *)&local_1f8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._0_8_ == paVar11) {
      return;
    }
    goto LAB_0010e1ee;
  }
LAB_0010cf72:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_);
  }
  return;
LAB_0010c800:
  if (lVar24 == lVar9) goto LAB_0010c896;
  goto LAB_0010c7da;
}

Assistant:

void Lexer::scan() {
    char c;
    // 标志是否为负数
    bool minus = false;
    // 跳过空白字符
    while (!reader_.eof()) {
        c = reader_.get();
        if (c == EOF) return;
        if (isspace(c))
            continue;
        else if (isnewline_(c))
            line_++;
        else if (c == '+' || c == '-') {
            char nc;
            // 判断是否出现多个连续的 +-符号
            while (isspace((nc = reader_.get())))
                ;
            if (c == nc) {
                throw SyntaxError("can not present continue symbol ++/--");
            } else {
                reader_.back();
                break;
            }
        } else
            break;
    }

    // )+   )- 向前看字符如果是 ) 说明当前的 +/- 一定是一个 减法或加法
    if (lookforward_ != ')' && !isexponent(lookforward_) &&
        (c == '-' || c == '+')) {
        // +100 / -100  0.+100
        // 对于表达式 1 + -100 和 1. - 100 可以识别出来
        if (!isdigit(lookforward_) && !isletter(lookforward_) &&
            lookforward_ != '.') {
            if (c == '-') minus = true;
            c = reader_.get();
            while (isspace(c)) c = reader_.get();
        }
    }
    // 保存前一个字符
    lookforward_ = c;

    switch (c) {
        case '&':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::And)));
        case '|':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Or)));
        case '!':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Not)));
        case '^':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Xor)));
        case '~':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Negate)));
        case '+':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Add)));
        case '-': {
            // -表示一个负数，而非减法
            if (minus) break;
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Sub)));
        }
        case '*': {
            if (auto [ok, c] = reader_.geteq('*'); ok) {
                return tokenlist_.push_back(
                    std::shared_ptr<Token>(new Token(Tag::Pow)));
            } else {
                return tokenlist_.push_back(
                    std::shared_ptr<Token>(new Token(Tag::Mul)));
            }
        }
        case '/':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Div)));
        case '=':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Equal)));
        case '%':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Mod)));
        case '<': {
            // <<左移
            if (auto [ok, c] = reader_.geteq('<'); ok)
                return tokenlist_.push_back(
                    std::shared_ptr<Token>(new Token(Tag::ShiftLeft)));
            else
                throw SyntaxError("unexpected <?");
        } break;
        case '>': {
            // >>右移
            if (auto [ok, c] = reader_.geteq('>'); ok)
                return tokenlist_.push_back(
                    std::shared_ptr<Token>(new Token(Tag::ShiftRight)));
            else
                throw SyntaxError("unexpected >?");
        }
        default:
            break;
    }
    /*
     * 处理进制数
     * 十六进制: 0xabcdef
     * 八进制:  0o1234567
     * 二进制:  0b1010101
     */
    if (c == '0') {
        // 处理小数
        if (reader_.peek() == '.') goto __integer_float_number_state;
        // 整数第一个数不能为0
        if (isdigit(reader_.peek()))
            throw ZeroNumberException(reader_.peek() - '0');

        c = reader_.get();
        std::string str;
        // 将非十进制的数字转化为十进制整数
        std::shared_ptr<Number> num = nullptr;

        // 判断下一个字符是否表示进制
        switch (c) {
            case 'x': {
                c = reader_.get();
                while (ishex(c)) {
                    str.append(1, c);
                    c = reader_.get();
                }
                if (isletter(c) && (c > 'f' || c > 'F'))
                    throw HexBinOctException(std::string(1, c));

                num = std::shared_ptr<Number>(
                    new Number(toBase<Integer, 16>(str)));
            } break;
            case 'o': {
                c = reader_.get();
                while (isoct(c)) {
                    str.append(1, c);
                    c = reader_.get();
                }
                if ((isdigit(c) && (c > '7' && c <= '9')) || isletter(c))
                    throw HexBinOctException(std::string(1, c));
                num = std::shared_ptr<Number>(
                    new Number(toBase<Integer, 8>(str)));
            } break;
            case 'b':
                c = reader_.get();
                while (isbin(c)) {
                    str.append(1, c);
                    c = reader_.get();
                }
                if ((isdigit(c) && (c > '1' && c <= '9')) || isletter(c))
                    throw HexBinOctException(std::string(1, c));
                num = std::shared_ptr<Number>(
                    new Number(toBase<Integer, 2>(str)));
                break;
            default:
                // 单独的整数0
                num = std::shared_ptr<Number>(new Number(0));
        }
        // 回退一个字符
        reader_.back();
        return tokenlist_.push_back(num);
    }

__integer_float_number_state:
    // 整数或浮点数
    if (isdigit(c) || c == '.') {
        std::string s;
        bool once_add_sub = false, once_exponent = false;
        if (minus) s += '-';
        if (c == '.') goto __float_state;
        do {
            if (isexponent(c)) {
                if (once_exponent) throw SyntaxError("expoent e/E is to many!");
                once_exponent = true;
            }
            // e/E+/-/数字
            if (c == '-' || c == '+') {
                // 只能出现一次e/E+/-
                if (isexponent(reader_.backc())) {
                    once_add_sub = true;
                    goto __float_state;
                } else
                    break;
            }
            s.append(1, c);
            c = reader_.get();
        } while (isdigit(c) || isexponent(c) || c == '-' || c == '+');
        if (c != '.') {
            // 读取到最后一个字符，但是数字后面存在一个E
            if (c == EOF) {
                if (once_exponent && !isdigit(reader_.backc()))
                    throw SyntaxError("after digit e/E errro");
            }
            reader_.back();
            lookforward_ = reader_.cur();
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Number(toAny<double>(s))));
        }
    __float_state:
        // 添加小数点
        s.append(1, c);
        for (;;) {
            c = reader_.get();
            if (isexponent(c)) {
                if (once_exponent) throw SyntaxError("expoent e/E is to many!");
                once_exponent = true;
            }
            if (c == '+' || c == '-') {
                // 再次出现 +/- 时就表示加减法
                if (once_add_sub) break;
                once_add_sub = true;
                // 只能在e/E后面出现一次+/-
                if (!isexponent(reader_.backc())) break;
            }
            if (!isdigit(c) && !isexponent(c) && c != '+' && c != '-') break;
            s.append(1, c);
        }
        reader_.back();
        lookforward_ = reader_.cur();
        return tokenlist_.push_back(
            std::shared_ptr<Token>(new Float(toAny<double>(s))));
    }
    // 变量名/函数名 可以是字母和数字的组合
    if (isletter(c)) {
        std::string b;
        // 字母
        do {
            b.append(1, c);
            c = reader_.get();
        } while (isletter(c));
        // 数字
        while (isdigit(c)) {
            b.append(1, c);
            c = reader_.get();
        }
        // 如果变量名表示的是一个函数名(查表)
        if (c == '(') {
            if (isUnaryFunction(b)) {
                reader_.back();
                is_function_ = true;
                return tokenlist_.push_back(
                    std::shared_ptr<Token>(new Function(b, minus)));
            } else if (isBinaryFunction(b)) {
                reader_.back();
                is_function_ = true;
                return tokenlist_.push_back(
                    std::shared_ptr<Token>(new BinaryFunction(b, minus)));
            } else
                throw FunctionNotDefined(b);
        } else {
            // 回退一个位置，因为还需要将 (
            // 作为token保存下来(目的是后续判断当前变量名是否是一个函数名)
            reader_.back();
            // 变量名不存在，则保存到变量表中。注意，函数名不需要保存到表中！！！
            if (auto it = variable.find(b); it == variable.end()) {
                auto word = std::shared_ptr<Token>(new Word(b, minus));
                variable[b] = word;
                return tokenlist_.push_back(word);
            } else {
                // 变量/常量附带一个负号标志
                // 比如 a=100;b=-a / -pi
                // 这里处理方法是将 -a 看作 -1 * a
                if (minus) {
                    tokenlist_.push_back(
                        std::shared_ptr<Token>(new Number(-1)));
                    tokenlist_.push_back(
                        std::shared_ptr<Token>(new Token(Tag::Mul)));
                }
                // 如果变量存在常量表中，那么就直接将这个变量替换为对应的常量值
                if (auto x = constant.find(it->first); x != constant.end()) {
                    return tokenlist_.push_back(
                        std::shared_ptr<Token>(new Float(x->second)));
                }
                // 否则直接返回表中变量名
                return tokenlist_.push_back(it->second);
            }
        }
        // 变量声明的分隔符;
    } else if (c == ';') {
        // ; ; 过滤多个连续的分隔符
        if (!tokenlist_.empty() && tokenlist_.back()->type() == Tag::END_SEP)
            return;
        return tokenlist_.push_back(
            std::shared_ptr<Token>(new Token(Tag::END_SEP)));

    } else if (c == '(') {
        // 函数的开始标志符 (
        if (is_function_) {
            bracket_match_.push(true);
            is_function_ = false;
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::BEGIN_FUNC)));
        }
        // 普通的左括号
        bracket_match_.push(false);
        is_function_ = false;
        return tokenlist_.push_back(
            std::shared_ptr<Token>(new Token(Tag::BEGIN_BRACKET)));

    } else if (c == ')') {
        // 如果栈为空，说明括号不匹配
        if (bracket_match_.empty())
            throw SyntaxError("expression unexpected (!");

        // 函数的结尾标识符 )
        bool isEndOfFunction = bracket_match_.top();
        bracket_match_.pop();
        if (isEndOfFunction) {
            is_function_ = false;
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::END_FUNC)));
        }
        // 普通的右括号
        is_function_ = false;
        return tokenlist_.push_back(
            std::shared_ptr<Token>(new Token(Tag::END_BRACKET)));
    }
    // 根据其字符来指定其token，比如二元函数的分隔符号,
    return tokenlist_.push_back(std::shared_ptr<Token>(new Token(c)));
}